

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU
          (Minefield_Response_NACK_PDU *this)

{
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Response_NACK_PDU_002230f8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID);
  this->m_ui8ReqID = '\0';
  this->m_ui8NumMisPdus = '\0';
  (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '(';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x1a;
  return;
}

Assistant:

Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU() :
    m_ui8ReqID( 0 ),
    m_ui8NumMisPdus( 0 )
{
    m_ui8PDUType = MinefieldResponseNAK_PDU_Type;
    m_ui16PDULength = MINEFIELD_RESPONSE_NACK_SIZE;
}